

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_add_window_update
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,
              int32_t window_size_increment)

{
  int iVar1;
  nghttp2_outbound_item *item;
  
  item = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0xa0);
  if (item == (nghttp2_outbound_item *)0x0) {
    iVar1 = -0x385;
  }
  else {
    nghttp2_outbound_item_init(item);
    nghttp2_frame_window_update_init
              ((nghttp2_window_update *)item,flags,stream_id,window_size_increment);
    iVar1 = nghttp2_session_add_item(session,item);
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      nghttp2_frame_window_update_free((nghttp2_window_update *)item);
      nghttp2_mem_free(&session->mem,item);
    }
  }
  return iVar1;
}

Assistant:

int nghttp2_session_add_window_update(nghttp2_session *session, uint8_t flags,
                                      int32_t stream_id,
                                      int32_t window_size_increment) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_mem *mem;

  mem = &session->mem;
  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_window_update_init(&frame->window_update, flags, stream_id,
                                   window_size_increment);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_window_update_free(&frame->window_update);
    nghttp2_mem_free(mem, item);
    return rv;
  }
  return 0;
}